

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O0

void anon_unknown.dwarf_13deeb::writeRead
               (Array2D<Imath_3_2::half> *ph1,char *fileName,int width,int height,LineOrder lorder)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  half *phVar6;
  float *pfVar7;
  Vec2<float> *this;
  Vec2<float> *v;
  char *__s2;
  Channel *pCVar8;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  Array2D<Imath_3_2::half> *in_RDI;
  int in_R8D;
  float fVar9;
  float fVar10;
  int x;
  int y_1;
  ConstIterator ii;
  ConstIterator hi;
  int y;
  int i;
  int N;
  FrameBuffer fb_1;
  Array2D<Imath_3_2::half> ph2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  InputFile in;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffbfc;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffc00;
  int local_1e8;
  int local_1e4;
  int local_1ac;
  int local_1a8;
  Slice local_1a0 [56];
  char local_168 [48];
  Array2D<Imath_3_2::half> local_138;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [72];
  char local_b0 [52];
  Channel local_7c [28];
  Vec2<float> local_60;
  Header local_58 [60];
  int local_1c;
  int local_18;
  int local_14;
  char *local_10;
  Array2D<Imath_3_2::half> *local_8;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"line order ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  iVar2 = local_14;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header
            (local_58,iVar2,local_18,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar4 = (int *)Imf_3_2::Header::lineOrder();
  *piVar4 = local_1c;
  pcVar5 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_7c,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar5,(Channel *)0x24ff54);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d03c6);
  phVar6 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_8,0);
  uVar12 = 0;
  uVar11 = 0;
  Imf_3_2::Slice::Slice
            ((Slice *)(local_f8 + 0x10),HALF,(char *)phVar6,2,(long)local_14 * 2,1,1,0.0,false,false
            );
  Imf_3_2::FrameBuffer::insert(local_b0,(Slice *)0x24ff54);
  poVar3 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  remove(local_10);
  pcVar5 = local_10;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)local_f8,pcVar5,local_58,iVar2);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_f8);
  Imf_3_2::OutputFile::writePixels((int)local_f8);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_f8);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d0514);
  poVar3 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  pcVar5 = local_10;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)local_108,pcVar5,iVar2);
  Imf_3_2::InputFile::header();
  local_110 = (int *)Imf_3_2::Header::dataWindow();
  local_114 = (local_110[2] - *local_110) + 1;
  local_118 = (local_110[3] - local_110[1]) + 1;
  local_11c = *local_110;
  local_120 = local_110[1];
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffc00,CONCAT44(in_stack_fffffffffffffbfc,uVar12),
             CONCAT44(in_stack_fffffffffffffbf4,uVar11));
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d0641);
  phVar6 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_138,(long)-local_120);
  uVar13 = 0;
  uVar12 = 0;
  uVar11 = 1;
  Imf_3_2::Slice::Slice
            (local_1a0,HALF,(char *)(phVar6 + -local_11c),2,(long)local_114 * 2,1,1,0.0,false,false)
  ;
  Imf_3_2::FrameBuffer::insert(local_168,(Slice *)0x24ff54);
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)local_108);
  for (local_1a8 = 0; local_1a8 < 7; local_1a8 = local_1a8 + 1) {
    for (local_1ac = local_110[1] + local_1a8; local_1ac <= local_110[3]; local_1ac = local_1ac + 7)
    {
      Imf_3_2::InputFile::readPixels((int)local_108);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::displayWindow();
  Imf_3_2::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffc00,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffbfc,uVar13));
  if (!bVar1) {
    __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x81,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffc00,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffbfc,uVar13));
  if (!bVar1) {
    __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x82,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  pfVar7 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar9 = *pfVar7;
  pfVar7 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar9 != *pfVar7) || (NAN(fVar9) || NAN(*pfVar7))) {
    __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x83,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  this = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(this,v);
  if (!bVar1) {
    __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x85,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  pfVar7 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar9 = *pfVar7;
  pfVar7 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar9 != *pfVar7) || (NAN(fVar9) || NAN(*pfVar7))) {
    __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x86,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  piVar4 = (int *)Imf_3_2::Header::lineOrder();
  iVar2 = *piVar4;
  piVar4 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar2 != *piVar4) {
    __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x87,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  Imf_3_2::InputFile::header();
  piVar4 = (int *)Imf_3_2::Header::compression();
  iVar2 = *piVar4;
  piVar4 = (int *)Imf_3_2::Header::compression();
  if (iVar2 == *piVar4) {
    Imf_3_2::Header::channels();
    Imf_3_2::ChannelList::begin();
    Imf_3_2::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12),
               (Iterator *)CONCAT44(in_stack_fffffffffffffbec,uVar11));
    Imf_3_2::InputFile::header();
    Imf_3_2::Header::channels();
    Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      Imf_3_2::ChannelList::end();
      Imf_3_2::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12),
                 (Iterator *)CONCAT44(in_stack_fffffffffffffbec,uVar11));
      bVar1 = Imf_3_2::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffbec,uVar11));
      if (!bVar1) {
        Imf_3_2::InputFile::header();
        Imf_3_2::Header::channels();
        Imf_3_2::ChannelList::end();
        bVar1 = Imf_3_2::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12),
                                    (ConstIterator *)CONCAT44(in_stack_fffffffffffffbec,uVar11));
        if (!bVar1) {
          __assert_fail("ii == in.header ().channels ().end ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x98,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        local_1e4 = 0;
        do {
          if (local_118 <= local_1e4) {
            Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d10ac);
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffbf4,uVar12));
            Imf_3_2::InputFile::~InputFile((InputFile *)local_108);
            remove(local_10);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            Imf_3_2::Header::~Header(local_58);
            return;
          }
          for (local_1e8 = 0; local_1e8 < local_114; local_1e8 = local_1e8 + 1) {
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_8,(long)local_1e4);
            fVar9 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffbf4,uVar12));
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_138,(long)local_1e4);
            fVar10 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffbf4,uVar12));
            if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                            ,0x9c,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                           );
            }
          }
          local_1e4 = local_1e4 + 1;
        } while( true );
      }
      pcVar5 = Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x1d0d51);
      __s2 = Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x1d0d68);
      iVar2 = strcmp(pcVar5,__s2);
      if (iVar2 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x8f,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0dc3);
      iVar2 = *(int *)pCVar8;
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0deb);
      if (iVar2 != *(int *)pCVar8) break;
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0e36);
      iVar2 = *(int *)(pCVar8 + 4);
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0e56);
      if (iVar2 != *(int *)(pCVar8 + 4)) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x91,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0e99);
      iVar2 = *(int *)(pCVar8 + 8);
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1d0eb9);
      if (iVar2 != *(int *)(pCVar8 + 8)) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12));
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar12));
    }
    __assert_fail("hi.channel ().type == ii.channel ().type",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                  ,0x90,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                 );
  }
  __assert_fail("in.header ().compression () == hdr.compression ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                ,0x88,
                "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
               );
}

Assistant:

void
writeRead (
    const Array2D<half>& ph1,
    const char           fileName[],
    int                  width,
    int                  height,
    LineOrder            lorder)
{
    //
    // Write the pixel data in ph1 to an image file using
    // the specified line order.  Read the pixel data back
    // from the file in pseudo-random order and verify that
    // the data did not change.
    //

    cout << "line order " << lorder << ":" << flush;

    Header hdr (width, height);
    hdr.lineOrder () = lorder;

    hdr.channels ().insert (
        "H", // name
        Channel (
            HALF, // type
            1,    // xSampling
            1)    // ySampling
    );

    {
        FrameBuffer fb;

        fb.insert (
            "H", // name
            Slice (
                HALF,                       // type
                (char*) &ph1[0][0],         // base
                sizeof (ph1[0][0]),         // xStride
                sizeof (ph1[0][0]) * width, // yStride
                1,                          // xSampling
                1)                          // ySampling
        );

        cout << " writing" << flush;

        remove (fileName);
        OutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    {
        cout << " reading" << flush;

        InputFile in (fileName);

        const Box2i& dw = in.header ().dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<half> ph2 (h, w);

        FrameBuffer fb;

        fb.insert (
            "H", // name
            Slice (
                HALF,                   // type
                (char*) &ph2[-dy][-dx], // base
                sizeof (ph2[0][0]),     // xStride
                sizeof (ph2[0][0]) * w, // yStride
                1,                      // xSampling
                1)                      // ySampling
        );

        in.setFrameBuffer (fb);

        //
        // Read the scan lines in this order:
        // 0, N, 2N, 3N, ... 1, N+1, 2N+1, ... 2, N+2, 2N+2, ...
        //

        const int N = 7;

        for (int i = 0; i < N; ++i)
            for (int y = dw.min.y + i; y <= dw.max.y; y += N)
                in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header ().displayWindow () == hdr.displayWindow ());
        assert (in.header ().dataWindow () == hdr.dataWindow ());
        assert (in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in.header ().lineOrder () == hdr.lineOrder ());
        assert (in.header ().compression () == hdr.compression ());

        ChannelList::ConstIterator hi = hdr.channels ().begin ();
        ChannelList::ConstIterator ii = in.header ().channels ().begin ();

        while (hi != hdr.channels ().end ())
        {
            assert (!strcmp (hi.name (), ii.name ()));
            assert (hi.channel ().type == ii.channel ().type);
            assert (hi.channel ().xSampling == ii.channel ().xSampling);
            assert (hi.channel ().ySampling == ii.channel ().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header ().channels ().end ());

        for (int y = 0; y < h; ++y)
            for (int x = 0; x < w; ++x)
                assert (ph1[y][x] == ph2[y][x]);
    }

    remove (fileName);
    cout << endl;
}